

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.c
# Opt level: O0

int check_purpose(X509_STORE_CTX *ctx,X509 *x,int purpose,int depth,int must_be_ca)

{
  int in_ECX;
  int in_EDX;
  X509 *in_RSI;
  long in_RDI;
  int in_R8D;
  int tr_ok;
  int in_stack_ffffffffffffffd0;
  int iVar1;
  int iVar2;
  
  iVar1 = 3;
  if ((*(int *)(in_RDI + 0x94) <= in_ECX) && (in_EDX == *(int *)(*(long *)(in_RDI + 0x20) + 0x20)))
  {
    iVar1 = X509_check_trust(in_RSI,*(int *)(*(long *)(in_RDI + 0x20) + 0x24),4);
  }
  if (iVar1 == 1) {
    return 1;
  }
  iVar2 = iVar1;
  if ((iVar1 != 2) &&
     (in_stack_ffffffffffffffd0 = X509_check_purpose(in_RSI,in_EDX,(uint)(0 < in_R8D)),
     in_stack_ffffffffffffffd0 != 0)) {
    if (in_stack_ffffffffffffffd0 == 1) {
      return 1;
    }
    if ((*(ulong *)(*(long *)(in_RDI + 0x20) + 0x18) & 0x20) == 0) {
      return 1;
    }
  }
  iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_EDX,in_ECX),(X509 *)CONCAT44(in_R8D,iVar2),
                         iVar1,in_stack_ffffffffffffffd0);
  return iVar1;
}

Assistant:

static int check_purpose(X509_STORE_CTX *ctx, X509 *x, int purpose, int depth,
                         int must_be_ca)
{
    int tr_ok = X509_TRUST_UNTRUSTED;

    /*
     * For trusted certificates we want to see whether any auxiliary trust
     * settings trump the purpose constraints.
     *
     * This is complicated by the fact that the trust ordinals in
     * ctx->param->trust are entirely independent of the purpose ordinals in
     * ctx->param->purpose!
     *
     * What connects them is their mutual initialization via calls from
     * X509_STORE_CTX_set_default() into X509_VERIFY_PARAM_lookup() which sets
     * related values of both param->trust and param->purpose.  It is however
     * typically possible to infer associated trust values from a purpose value
     * via the X509_PURPOSE API.
     *
     * Therefore, we can only check for trust overrides when the purpose we're
     * checking is the same as ctx->param->purpose and ctx->param->trust is
     * also set.
     */
    if (depth >= ctx->num_untrusted && purpose == ctx->param->purpose)
        tr_ok = X509_check_trust(x, ctx->param->trust, X509_TRUST_NO_SS_COMPAT);

    switch (tr_ok) {
    case X509_TRUST_TRUSTED:
        return 1;
    case X509_TRUST_REJECTED:
        break;
    default:
        switch (X509_check_purpose(x, purpose, must_be_ca > 0)) {
        case 1:
            return 1;
        case 0:
            break;
        default:
            if ((ctx->param->flags & X509_V_FLAG_X509_STRICT) == 0)
                return 1;
        }
        break;
    }

    return verify_cb_cert(ctx, x, depth, X509_V_ERR_INVALID_PURPOSE);
}